

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMDocumentImpl::removeChild(DOMDocumentImpl *this,DOMNode *oldChild)

{
  int iVar1;
  long lVar2;
  
  DOMParentNode::removeChild(&this->fParent,oldChild);
  iVar1 = (*oldChild->_vptr_DOMNode[4])(oldChild);
  lVar2 = 0x130;
  if (iVar1 != 1) {
    iVar1 = (*oldChild->_vptr_DOMNode[4])(oldChild);
    lVar2 = 0x128;
    if (iVar1 != 10) {
      return oldChild;
    }
  }
  *(undefined8 *)((long)&(this->super_DOMMemoryManager)._vptr_DOMMemoryManager + lVar2) = 0;
  return oldChild;
}

Assistant:

DOMNode *DOMDocumentImpl::removeChild(DOMNode *oldChild)
{
    fParent.removeChild(oldChild);

    // If remove succeeded, un-cache the kid appropriately
    if(oldChild->getNodeType() == DOMNode::ELEMENT_NODE)
        fDocElement=0;
    else if(oldChild->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
        fDocType=0;

    return oldChild;
}